

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaHeat2D_kry.c
# Opt level: O0

void PrintOutput(void *mem,sunrealtype t,N_Vector uu)

{
  undefined4 uVar1;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_XMM0_Qa;
  int retval;
  int kused;
  long nps;
  long npe;
  long nli;
  long nreLS;
  long nre;
  long nje;
  long nni;
  long nst;
  sunrealtype umax;
  sunrealtype hused;
  undefined8 in_stack_ffffffffffffff78;
  int opt;
  char *in_stack_ffffffffffffff80;
  void *in_stack_ffffffffffffff88;
  uint local_6c;
  undefined8 local_68;
  undefined8 local_60;
  undefined1 local_58 [8];
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20 [2];
  undefined8 local_10;
  undefined8 local_8;
  
  opt = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  local_10 = in_XMM0_Qa;
  local_8 = in_RDI;
  local_28 = N_VMaxNorm(in_RSI);
  IDAGetLastOrder(local_8,&local_6c);
  check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,opt);
  IDAGetNumSteps(local_8,&local_30);
  check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,opt);
  IDAGetNumNonlinSolvIters(local_8,&local_38);
  check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,opt);
  IDAGetNumResEvals(local_8,&local_48);
  check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,opt);
  IDAGetLastStep(local_8,local_20);
  check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,opt);
  IDAGetNumJtimesEvals(local_8,&local_40);
  check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,opt);
  IDAGetNumLinIters(local_8,local_58);
  check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,opt);
  IDAGetNumLinResEvals(local_8,&local_50);
  check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,opt);
  IDAGetNumPrecEvals(local_8,&local_60);
  check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,opt);
  uVar1 = IDAGetNumPrecSolves(local_8,&local_68);
  check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,opt);
  printf(" %5.2f %13.5e  %d  %3ld  %3ld  %3ld  %4ld  %4ld  %9.2e  %3ld %3ld\n",local_10,local_28,
         local_20[0],(ulong)local_6c,local_30,local_38,local_40,local_48,local_50,local_60,local_68,
         uVar1);
  return;
}

Assistant:

static void PrintOutput(void* mem, sunrealtype t, N_Vector uu)
{
  sunrealtype hused, umax;
  long int nst, nni, nje, nre, nreLS, nli, npe, nps;
  int kused, retval;

  umax = N_VMaxNorm(uu);

  retval = IDAGetLastOrder(mem, &kused);
  check_retval(&retval, "IDAGetLastOrder", 1);
  retval = IDAGetNumSteps(mem, &nst);
  check_retval(&retval, "IDAGetNumSteps", 1);
  retval = IDAGetNumNonlinSolvIters(mem, &nni);
  check_retval(&retval, "IDAGetNumNonlinSolvIters", 1);
  retval = IDAGetNumResEvals(mem, &nre);
  check_retval(&retval, "IDAGetNumResEvals", 1);
  retval = IDAGetLastStep(mem, &hused);
  check_retval(&retval, "IDAGetLastStep", 1);
  retval = IDAGetNumJtimesEvals(mem, &nje);
  check_retval(&retval, "IDAGetNumJtimesEvals", 1);
  retval = IDAGetNumLinIters(mem, &nli);
  check_retval(&retval, "IDAGetNumLinIters", 1);
  retval = IDAGetNumLinResEvals(mem, &nreLS);
  check_retval(&retval, "IDAGetNumLinResEvals", 1);
  retval = IDAGetNumPrecEvals(mem, &npe);
  check_retval(&retval, "IDAGetNumPrecEvals", 1);
  retval = IDAGetNumPrecSolves(mem, &nps);
  check_retval(&retval, "IDAGetNumPrecSolves", 1);

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf(" %5.2Lf %13.5Le  %d  %3ld  %3ld  %3ld  %4ld  %4ld  %9.2Le  %3ld "
         "%3ld\n",
         t, umax, kused, nst, nni, nje, nre, nreLS, hused, npe, nps);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf(" %5.2f %13.5e  %d  %3ld  %3ld  %3ld  %4ld  %4ld  %9.2e  %3ld %3ld\n",
         t, umax, kused, nst, nni, nje, nre, nreLS, hused, npe, nps);
#else
  printf(" %5.2f %13.5e  %d  %3ld  %3ld  %3ld  %4ld  %4ld  %9.2e  %3ld %3ld\n",
         t, umax, kused, nst, nni, nje, nre, nreLS, hused, npe, nps);
#endif
}